

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall
FileTokenizer::convertFloat(FileTokenizer *this,size_t start,size_t end,double *result)

{
  char *__nptr;
  long lVar1;
  long lVar2;
  double dVar3;
  char *local_50;
  char *end_ptr;
  string str;
  double *result_local;
  size_t end_local;
  size_t start_local;
  FileTokenizer *this_local;
  
  str.field_2._8_8_ = result;
  std::__cxx11::string::substr((ulong)&end_ptr,(ulong)&this->currentLine);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar3 = strtod(__nptr,&local_50);
  *(double *)str.field_2._8_8_ = dVar3;
  lVar1 = std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::size();
  std::__cxx11::string::~string((string *)&end_ptr);
  return (char *)(lVar1 + lVar2) == local_50;
}

Assistant:

bool FileTokenizer::convertFloat(size_t start, size_t end, double& result)
{
	std::string str = currentLine.substr(start, end - start);
	char* end_ptr;

	result = strtod(str.c_str(), &end_ptr);
	return str.c_str() + str.size() == end_ptr;
}